

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall
fasttext::Autotune::train(Autotune *this,Args *autotuneArgs,AutotuneCallback *callback)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  invalid_argument *this_00;
  runtime_error *this_01;
  ostream *poVar5;
  void *this_02;
  long in_RSI;
  undefined8 *in_RDI;
  string errorMessage;
  EncounteredNaNError *anon_var_0;
  bad_alloc *anon_var_0_1;
  TimeoutError *anon_var_0_2;
  AbortError *anon_var_0_3;
  Meter meter;
  string *metricLabel;
  bool sizeConstraintOK;
  double currentScore;
  ElapsedTimeMarker elapsedTimeMarker;
  Args trainArgs;
  Args bestTrainArgs;
  int verbose;
  bool sizeConstraintWarning;
  ifstream validationFileStream;
  pointer in_stack_fffffffffffff6c8;
  AutotuneStrategy *in_stack_fffffffffffff6d0;
  Args *pAVar6;
  double in_stack_fffffffffffff6d8;
  Meter *in_stack_fffffffffffff6e0;
  function<void_(double,_int,_double,_double)> *in_stack_fffffffffffff6e8;
  function<void_(double,_int,_double,_double)> *in_stack_fffffffffffff6f0;
  string *in_stack_fffffffffffff700;
  double in_stack_fffffffffffff708;
  Args *in_stack_fffffffffffff710;
  Args *in_stack_fffffffffffff718;
  AutotuneStrategy *in_stack_fffffffffffff720;
  Args *in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff74c;
  Args *in_stack_fffffffffffff750;
  Autotune *in_stack_fffffffffffff758;
  Args *in_stack_fffffffffffff778;
  Meter *in_stack_fffffffffffff798;
  undefined7 in_stack_fffffffffffff7b0;
  string local_828 [68];
  metric_name local_7e4;
  string local_768 [16];
  Args *in_stack_fffffffffffff8a8;
  Autotune *in_stack_fffffffffffff8b0;
  Args *local_718;
  double in_stack_fffffffffffff910;
  AutotuneStrategy *in_stack_fffffffffffff918;
  Args *in_stack_fffffffffffff978;
  Autotune *in_stack_fffffffffffff980;
  TrainCallback *in_stack_fffffffffffff9c0;
  Args *in_stack_fffffffffffff9c8;
  FastText *in_stack_fffffffffffff9d0;
  Args local_220;
  long local_10;
  
  pAVar6 = &local_220;
  local_10 = in_RSI;
  std::ifstream::ifstream(pAVar6,(string *)(in_RSI + 0x128),_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Validation file cannot be opened!");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  printSkippedArgs(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  std::function<void_(double,_int,_double,_double)>::operator=
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  *(undefined4 *)(in_RDI + 0xb) = *(undefined4 *)(local_10 + 400);
  bVar1 = false;
  Args::Args(&in_stack_fffffffffffff720->bestArgs_,in_stack_fffffffffffff718);
  Args::Args(&in_stack_fffffffffffff720->bestArgs_,in_stack_fffffffffffff718);
  operator_new(0x1d8);
  AutotuneStrategy::AutotuneStrategy
            (in_stack_fffffffffffff720,in_stack_fffffffffffff718,
             (result_type)in_stack_fffffffffffff710);
  std::unique_ptr<fasttext::AutotuneStrategy,std::default_delete<fasttext::AutotuneStrategy>>::
  unique_ptr<std::default_delete<fasttext::AutotuneStrategy>,void>
            ((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
              *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  std::unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>::
  operator=((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
             *)in_stack_fffffffffffff6d0,
            (unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
             *)in_stack_fffffffffffff6c8);
  std::unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>::
  ~unique_ptr((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
               *)in_stack_fffffffffffff6e0);
  startTimer(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  while (bVar3 = keepTraining((Autotune *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8),
        bVar3) {
    *(int *)(in_RDI + 3) = *(int *)(in_RDI + 3) + 1;
    std::unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>::
    operator->((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
                *)0x1191aa);
    AutotuneStrategy::ask(in_stack_fffffffffffff918,in_stack_fffffffffffff910);
    Args::operator=(&in_stack_fffffffffffff6d0->bestArgs_,&in_stack_fffffffffffff6c8->bestArgs_);
    Args::~Args(&in_stack_fffffffffffff6d0->bestArgs_);
    if (2 < *(int *)(local_10 + 0xe0)) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Trial = ");
      in_stack_fffffffffffff778 = (Args *)std::ostream::operator<<(poVar5,*(int *)(in_RDI + 3));
      std::ostream::operator<<(in_stack_fffffffffffff778,std::endl<char,std::char_traits<char>>);
    }
    printArgs((Autotune *)in_stack_fffffffffffff720,in_stack_fffffffffffff718,
              in_stack_fffffffffffff710);
    anon_unknown.dwarf_2e523::ElapsedTimeMarker::ElapsedTimeMarker
              ((ElapsedTimeMarker *)in_stack_fffffffffffff6d0);
    local_718 = (Args *)std::numeric_limits<double>::quiet_NaN();
    std::function<void_(float,_float,_double,_double,_long)>::function
              ((function<void_(float,_float,_double,_double,_long)> *)in_stack_fffffffffffff6d0);
    FastText::train(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    std::function<void_(float,_float,_double,_double,_long)>::~function
              ((function<void_(float,_float,_double,_double,_long)> *)0x119344);
    bVar3 = quantize(in_stack_fffffffffffff758,in_stack_fffffffffffff750,
                     (Args *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
    if (bVar3) {
      Args::getAutotuneMetricLabel_abi_cxx11_(in_stack_fffffffffffff778);
      std::__cxx11::string::empty();
      Meter::Meter(in_stack_fffffffffffff6e0,SUB81((ulong)in_stack_fffffffffffff6d8 >> 0x38,0));
      FastText::test((FastText *)CONCAT17(bVar2,in_stack_fffffffffffff7b0),(istream *)pAVar6,
                     (int32_t)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),in_stack_fffffffffffff798);
      local_7e4 = Args::getAutotuneMetric(pAVar6);
      in_stack_fffffffffffff758 =
           (Autotune *)Args::getAutotuneMetricValue(in_stack_fffffffffffff730);
      local_718 = (Args *)getMetricScore((Autotune *)in_stack_fffffffffffff720,
                                         (Meter *)in_stack_fffffffffffff718,
                                         (metric_name *)in_stack_fffffffffffff710,
                                         in_stack_fffffffffffff708,in_stack_fffffffffffff700);
      in_stack_fffffffffffff750 = local_718;
      if ((((double)in_RDI[2] == -1.0) && (!NAN((double)in_RDI[2]))) ||
         ((double)in_RDI[2] <= (double)local_718 && (double)local_718 != (double)in_RDI[2])) {
        Args::operator=(&in_stack_fffffffffffff6d0->bestArgs_,&in_stack_fffffffffffff6c8->bestArgs_)
        ;
        in_RDI[2] = local_718;
        std::
        unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>::
        operator->((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
                    *)0x1194fb);
        AutotuneStrategy::updateBest
                  (in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->bestArgs_);
      }
      Meter::~Meter((Meter *)in_stack_fffffffffffff6d0);
      std::__cxx11::string::~string(local_768);
    }
    else {
      *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) + 1;
      if (((!bVar1) && (10 < *(int *)(in_RDI + 3))) &&
         (*(int *)(in_RDI + 3) / 2 < *(int *)((long)in_RDI + 0x1c))) {
        bVar1 = true;
        in_stack_fffffffffffff730 =
             (Args *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)in_stack_fffffffffffff730,
                                 "Warning : requested model size is probably too small. You may want to increase `autotune-modelsize`."
                                );
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    if (2 < *(int *)(local_10 + 0xe0)) {
      uVar4 = std::isnan((double)local_718);
      in_stack_fffffffffffff748 = CONCAT13((char)uVar4,(int3)in_stack_fffffffffffff748);
      if ((uVar4 & 1) == 0) {
        in_stack_fffffffffffff720 =
             (AutotuneStrategy *)std::operator<<((ostream *)&std::cout,"currentScore = ");
        in_stack_fffffffffffff718 =
             (Args *)std::ostream::operator<<(in_stack_fffffffffffff720,(double)local_718);
        std::ostream::operator<<(in_stack_fffffffffffff718,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"currentScore = NaN");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    if (2 < *(int *)(local_10 + 0xe0)) {
      in_stack_fffffffffffff710 = (Args *)std::operator<<((ostream *)&std::cout,"train took = ");
      in_stack_fffffffffffff708 =
           anon_unknown.dwarf_2e523::ElapsedTimeMarker::getElapsed
                     ((ElapsedTimeMarker *)in_stack_fffffffffffff6d0);
      in_stack_fffffffffffff700 =
           (string *)std::ostream::operator<<(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
      std::ostream::operator<<(in_stack_fffffffffffff700,std::endl<char,std::char_traits<char>>);
    }
  }
  bVar3 = std::thread::joinable((thread *)in_stack_fffffffffffff6d0);
  if (bVar3) {
    std::thread::join();
  }
  if (((double)in_RDI[2] == -1.0) && (!NAN((double)in_RDI[2]))) {
    std::__cxx11::string::string(local_828);
    if (bVar1) {
      std::__cxx11::string::operator=
                (local_828,
                 "Couldn\'t fulfil model size constraint: please increase `autotune-modelsize`.");
    }
    else {
      std::__cxx11::string::operator=
                (local_828,
                 "Didn\'t have enough time to train once: please increase `autotune-duration`.");
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,local_828);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Training again with best arguments");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (2 < *(int *)(local_10 + 0xe0)) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Best selected args = ");
    this_02 = (void *)std::ostream::operator<<(poVar5,0);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  }
  printArgs((Autotune *)in_stack_fffffffffffff720,in_stack_fffffffffffff718,
            in_stack_fffffffffffff710);
  pAVar6 = (Args *)*in_RDI;
  std::function<void_(float,_float,_double,_double,_long)>::function
            ((function<void_(float,_float,_double,_double,_long)> *)pAVar6);
  FastText::train(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
  std::function<void_(float,_float,_double,_double,_long)>::~function
            ((function<void_(float,_float,_double,_double,_long)> *)0x119a7d);
  quantize(in_stack_fffffffffffff758,in_stack_fffffffffffff750,
           (Args *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  Args::~Args(pAVar6);
  Args::~Args(pAVar6);
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

void Autotune::train(const Args& autotuneArgs, const AutotuneCallback& callback) {
  std::ifstream validationFileStream(autotuneArgs.autotuneValidationFile);
  if (!validationFileStream.is_open()) {
    throw std::invalid_argument("Validation file cannot be opened!");
  }
  printSkippedArgs(autotuneArgs);

  this->callback_ = callback;
  this->verbose_ = autotuneArgs.autotuneVerbose;

  bool sizeConstraintWarning = false;
  int verbose = autotuneArgs.verbose;
  Args bestTrainArgs(autotuneArgs);
  Args trainArgs(autotuneArgs);
  trainArgs.verbose = 0;
  strategy_ = std::unique_ptr<AutotuneStrategy>(
      new AutotuneStrategy(trainArgs, autotuneArgs.seed));
  startTimer(autotuneArgs);

  while (keepTraining(autotuneArgs.autotuneDuration)) {
    trials_++;

    trainArgs = strategy_->ask(elapsed_);
    LOG_VAL(Trial, trials_)
    printArgs(trainArgs, autotuneArgs);
    ElapsedTimeMarker elapsedTimeMarker;
    double currentScore = std::numeric_limits<double>::quiet_NaN();
    try {
      fastText_->train(trainArgs);
      bool sizeConstraintOK = quantize(trainArgs, autotuneArgs);
      if (sizeConstraintOK) {
        const auto& metricLabel = autotuneArgs.getAutotuneMetricLabel();
        Meter meter(!metricLabel.empty());
        fastText_->test(
            validationFileStream, autotuneArgs.autotunePredictions, 0.0, meter);

        currentScore = getMetricScore(
            meter,
            autotuneArgs.getAutotuneMetric(),
            autotuneArgs.getAutotuneMetricValue(),
            metricLabel);

        if (bestScore_ == kUnknownBestScore || (currentScore > bestScore_)) {
          bestTrainArgs = trainArgs;
          bestScore_ = currentScore;
          strategy_->updateBest(bestTrainArgs);
        }
      } else {
        sizeConstraintFailed_++;
        if (!sizeConstraintWarning && trials_ > 10 &&
            sizeConstraintFailed_ > (trials_ / 2)) {
          sizeConstraintWarning = true;
          std::cerr << std::endl
                    << "Warning : requested model size is probably too small. "
                       "You may want to increase `autotune-modelsize`."
                    << std::endl;
        }
      }
    } catch (DenseMatrix::EncounteredNaNError&) {
      // ignore diverging loss and go on
    } catch (std::bad_alloc&) {
      // ignore parameter samples asking too much memory
    } catch (TimeoutError&) {
      break;
    } catch (FastText::AbortError&) {
      break;
    }
    LOG_VAL_NAN(currentScore, currentScore)
    LOG_VAL(train took, elapsedTimeMarker.getElapsed())
  }
  if (timer_.joinable()) {
    timer_.join();
  }

  if (bestScore_ == kUnknownBestScore) {
    std::string errorMessage;
    if (sizeConstraintWarning) {
      errorMessage =
          "Couldn't fulfil model size constraint: please increase "
          "`autotune-modelsize`.";
    } else {
      errorMessage =
          "Didn't have enough time to train once: please increase "
          "`autotune-duration`.";
    }
    throw std::runtime_error(errorMessage);
  } else {
    std::cerr << std::endl;
    std::cerr << "Training again with best arguments" << std::endl;
    bestTrainArgs.verbose = verbose;
    LOG_VAL(Best selected args, 0)
    printArgs(bestTrainArgs, autotuneArgs);
    fastText_->train(bestTrainArgs);
    quantize(bestTrainArgs, autotuneArgs);
  }
}